

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbkdf.cc
# Opt level: O3

int PKCS5_PBKDF2_HMAC(char *pass,int passlen,uchar *salt,int saltlen,int iter,EVP_MD *digest,
                     int keylen,uchar *out)

{
  int iVar1;
  int iVar2;
  ulong len;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  undefined4 in_register_0000000c;
  ulong __n;
  undefined4 in_stack_0000000c;
  uint8_t digest_tmp [64];
  ScopedHMAC_CTX hctx;
  uint local_f4;
  ulong local_f0;
  uchar *local_e8;
  size_t local_e0;
  byte local_d8 [64];
  undefined4 extraout_var;
  
  local_e0 = CONCAT44(in_register_0000000c,saltlen);
  local_e8 = salt;
  HMAC_CTX_init((HMAC_CTX *)&stack0xffffffffffffff68);
  uVar5 = 0;
  iVar1 = HMAC_Init_ex((HMAC_CTX *)&stack0xffffffffffffff68,pass,passlen,digest,(ENGINE *)0x0);
  if (iVar1 != 0) {
    uVar4 = CONCAT44(in_stack_0000000c,keylen);
    iVar1 = EVP_MD_size(digest);
    len = CONCAT44(extraout_var,iVar1);
    if (uVar4 != 0) {
      uVar5 = 1;
      do {
        __n = uVar4;
        if (len < uVar4) {
          __n = len;
        }
        local_f4 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
        local_f0 = uVar4;
        iVar1 = HMAC_Init_ex((HMAC_CTX *)&stack0xffffffffffffff68,(void *)0x0,0,(EVP_MD *)0x0,
                             (ENGINE *)0x0);
        if (iVar1 == 0) {
LAB_0021d0b3:
          uVar5 = 0;
          goto LAB_0021d0b6;
        }
        iVar1 = HMAC_Update((HMAC_CTX *)&stack0xffffffffffffff68,local_e8,local_e0);
        if (iVar1 == 0) goto LAB_0021d0b3;
        iVar1 = HMAC_Update((HMAC_CTX *)&stack0xffffffffffffff68,(uchar *)&local_f4,4);
        if (iVar1 == 0) goto LAB_0021d0b3;
        iVar1 = HMAC_Final((HMAC_CTX *)&stack0xffffffffffffff68,local_d8,(uint *)0x0);
        if (iVar1 == 0) goto LAB_0021d0b3;
        if (len != 0) {
          memcpy(out,local_d8,__n);
        }
        if (1 < (uint)iter) {
          iVar1 = 1;
          do {
            iVar2 = HMAC_Init_ex((HMAC_CTX *)&stack0xffffffffffffff68,(void *)0x0,0,(EVP_MD *)0x0,
                                 (ENGINE *)0x0);
            if (iVar2 == 0) goto LAB_0021d0b3;
            iVar2 = HMAC_Update((HMAC_CTX *)&stack0xffffffffffffff68,local_d8,len);
            if (iVar2 == 0) goto LAB_0021d0b3;
            iVar2 = HMAC_Final((HMAC_CTX *)&stack0xffffffffffffff68,local_d8,(uint *)0x0);
            if (iVar2 == 0) goto LAB_0021d0b3;
            if (len != 0) {
              lVar3 = 0;
              do {
                out[lVar3] = out[lVar3] ^ local_d8[lVar3];
                lVar3 = lVar3 + 1;
              } while (__n + (__n == 0) != lVar3);
            }
            iVar1 = iVar1 + 1;
          } while (iVar1 != iter);
        }
        out = out + __n;
        uVar5 = uVar5 + 1;
        uVar4 = local_f0 - __n;
      } while (uVar4 != 0);
    }
    uVar5 = (uint)(iter != 0);
  }
LAB_0021d0b6:
  HMAC_CTX_cleanup((HMAC_CTX *)&stack0xffffffffffffff68);
  return uVar5;
}

Assistant:

int PKCS5_PBKDF2_HMAC(const char *password, size_t password_len,
                      const uint8_t *salt, size_t salt_len, uint32_t iterations,
                      const EVP_MD *digest, size_t key_len, uint8_t *out_key) {
  // See RFC 8018, section 5.2.
  bssl::ScopedHMAC_CTX hctx;
  if (!HMAC_Init_ex(hctx.get(), password, password_len, digest, NULL)) {
    return 0;
  }

  uint32_t i = 1;
  size_t md_len = EVP_MD_size(digest);
  while (key_len > 0) {
    size_t todo = md_len;
    if (todo > key_len) {
      todo = key_len;
    }

    uint8_t i_buf[4];
    i_buf[0] = (uint8_t)((i >> 24) & 0xff);
    i_buf[1] = (uint8_t)((i >> 16) & 0xff);
    i_buf[2] = (uint8_t)((i >> 8) & 0xff);
    i_buf[3] = (uint8_t)(i & 0xff);

    // Compute U_1.
    uint8_t digest_tmp[EVP_MAX_MD_SIZE];
    if (!HMAC_Init_ex(hctx.get(), NULL, 0, NULL, NULL) ||
        !HMAC_Update(hctx.get(), salt, salt_len) ||
        !HMAC_Update(hctx.get(), i_buf, 4) ||
        !HMAC_Final(hctx.get(), digest_tmp, NULL)) {
      return 0;
    }

    OPENSSL_memcpy(out_key, digest_tmp, todo);
    for (uint32_t j = 1; j < iterations; j++) {
      // Compute the remaining U_* values and XOR.
      if (!HMAC_Init_ex(hctx.get(), NULL, 0, NULL, NULL) ||
          !HMAC_Update(hctx.get(), digest_tmp, md_len) ||
          !HMAC_Final(hctx.get(), digest_tmp, NULL)) {
        return 0;
      }
      for (size_t k = 0; k < todo; k++) {
        out_key[k] ^= digest_tmp[k];
      }
    }

    key_len -= todo;
    out_key += todo;
    i++;
  }

  // RFC 8018 describes iterations (c) as being a "positive integer", so a
  // value of 0 is an error.
  //
  // Unfortunately not all consumers of PKCS5_PBKDF2_HMAC() check their return
  // value, expecting it to succeed and unconditionally using |out_key|.  As a
  // precaution for such callsites in external code, the old behavior of
  // iterations < 1 being treated as iterations == 1 is preserved, but
  // additionally an error result is returned.
  //
  // TODO(eroman): Figure out how to remove this compatibility hack, or change
  // the default to something more sensible like 2048.
  if (iterations == 0) {
    return 0;
  }

  return 1;
}